

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_jitshared.c
# Opt level: O0

void emit_op_loadk(function *fn,int A,int Bx,int pc)

{
  LuaType LVar1;
  TValue *pTVar2;
  TValue *Konst;
  int pc_local;
  int Bx_local;
  int A_local;
  function *fn_local;
  
  emit_reg(fn,"ra",A);
  pTVar2 = fn->p->k + Bx;
  LVar1 = pTVar2->tt_;
  if (LVar1 == 1) {
    membuff_add_fstring(&fn->body,"setbvalue(ra, %d);\n",(ulong)(uint)(pTVar2->value_).b);
  }
  else if (LVar1 == 3) {
    membuff_add_fstring(&fn->body,"setfltvalue(ra, %.17g);\n",(pTVar2->value_).gc);
  }
  else if (LVar1 == 0x13) {
    membuff_add_fstring(&fn->body,"setivalue(ra, %lld);\n",(pTVar2->value_).gc);
  }
  else {
    membuff_add_fstring(&fn->body,"rb = K(%d);\n",(ulong)(uint)Bx);
    membuff_add_fstring(&fn->body,"setobj2s(L, ra, rb);\n");
  }
  return;
}

Assistant:

static void emit_op_loadk(struct function *fn, int A, int Bx, int pc) {
  emit_reg(fn, "ra", A);
  (void)pc;
  TValue *Konst = &fn->p->k[Bx];
  switch (Konst->tt_) {
    case LUA_TNUMINT:
      membuff_add_fstring(&fn->body, "setivalue(ra, %lld);\n", Konst->value_.i);
      break;
    case LUA_TNUMFLT:
      membuff_add_fstring(&fn->body, "setfltvalue(ra, %.17g);\n", Konst->value_.n);
      break;
    case LUA_TBOOLEAN:
      membuff_add_fstring(&fn->body, "setbvalue(ra, %d);\n", Konst->value_.b);
      break;
    default: {
      membuff_add_fstring(&fn->body, "rb = K(%d);\n", Bx);
      membuff_add_fstring(&fn->body, "setobj2s(L, ra, rb);\n");
      break;
    }
  }
}